

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

plutovg_paint_t *
plutovg_paint_create_texture
          (plutovg_surface_t *surface,plutovg_texture_type_t type,float opacity,
          plutovg_matrix_t *matrix)

{
  float fVar1;
  plutovg_paint_t *ppVar2;
  plutovg_paint_t *ppVar3;
  plutovg_paint_t pVar4;
  float local_48;
  float local_44;
  plutovg_texture_paint_t *texture;
  plutovg_matrix_t *matrix_local;
  float opacity_local;
  plutovg_texture_type_t type_local;
  plutovg_surface_t *surface_local;
  
  ppVar2 = (plutovg_paint_t *)plutovg_paint_create(PLUTOVG_PAINT_TYPE_TEXTURE,0x30);
  ppVar2[1].ref_count = type;
  if (0.0 <= opacity) {
    local_48 = opacity;
    if (1.0 < opacity) {
      local_48 = 1.0;
    }
    local_44 = local_48;
  }
  else {
    local_44 = 0.0;
  }
  ppVar2[1].type = (plutovg_paint_type_t)local_44;
  ppVar3 = ppVar2 + 2;
  if (matrix == (plutovg_matrix_t *)0x0) {
    ppVar3->ref_count = 0x3f800000;
    ppVar3->type = PLUTOVG_PAINT_TYPE_COLOR;
    ppVar2[3].ref_count = 0;
    ppVar2[3].type = 0x3f800000;
    ppVar2[4].ref_count = 0;
    ppVar2[4].type = PLUTOVG_PAINT_TYPE_COLOR;
  }
  else {
    fVar1 = matrix->b;
    ppVar3->ref_count = (int)matrix->a;
    ppVar3->type = (plutovg_paint_type_t)fVar1;
    fVar1 = matrix->d;
    ppVar2[3].ref_count = (int)matrix->c;
    ppVar2[3].type = (plutovg_paint_type_t)fVar1;
    fVar1 = matrix->f;
    ppVar2[4].ref_count = (int)matrix->e;
    ppVar2[4].type = (plutovg_paint_type_t)fVar1;
  }
  pVar4 = (plutovg_paint_t)plutovg_surface_reference(surface);
  ppVar2[5] = pVar4;
  return ppVar2;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_texture(plutovg_surface_t* surface, plutovg_texture_type_t type, float opacity, const plutovg_matrix_t* matrix)
{
    plutovg_texture_paint_t* texture = plutovg_paint_create(PLUTOVG_PAINT_TYPE_TEXTURE, sizeof(plutovg_texture_paint_t));
    texture->type = type;
    texture->opacity = plutovg_clamp(opacity, 0.f, 1.f);
    texture->matrix = matrix ? *matrix : PLUTOVG_IDENTITY_MATRIX;
    texture->surface = plutovg_surface_reference(surface);
    return &texture->base;
}